

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O0

int testSystemTools(int param_1,char **param_2)

{
  undefined4 uVar1;
  __type _Var2;
  ostream *poVar3;
  string local_a0;
  allocator local_79;
  undefined1 local_78 [8];
  string strupper;
  allocator local_41;
  undefined1 local_40 [8];
  string str;
  int failed;
  char **param_1_local;
  int param_0_local;
  
  str.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"abc",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,"ABC",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cmsys::SystemTools::UpperCase(&local_a0,(string *)local_40);
  _Var2 = std::operator==(&local_a0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
  std::__cxx11::string::~string((string *)&local_a0);
  if (_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Passed: ");
    poVar3 = std::operator<<(poVar3,"cmSystemTools::UpperCase is working");
    std::operator<<(poVar3,"\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
    poVar3 = std::operator<<(poVar3,"cmSystemTools::UpperCase is working");
    std::operator<<(poVar3,"\n");
    str.field_2._12_4_ = 1;
  }
  uVar1 = str.field_2._12_4_;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return uVar1;
}

Assistant:

int testSystemTools(int, char*[])
{
  int failed = 0;
  // ----------------------------------------------------------------------
  // Test cmSystemTools::UpperCase
  std::string str = "abc";
  std::string strupper = "ABC";
  if(cmSystemTools::UpperCase(str) == strupper)
    {
    cmPassed("cmSystemTools::UpperCase is working");
    }
  else
    {
    cmFailed("cmSystemTools::UpperCase is working");
    }
  return failed;
}